

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ProcessMorphAnimDatas
          (FBXConverter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
          *morphAnimDatas,BlendShapeChannel *bsc,AnimationCurveNode *node)

{
  Document *pDVar1;
  undefined8 this_00;
  iterator this_01;
  BlendShapeChannel *pBVar2;
  bool bVar3;
  uint64_t uVar4;
  reference ppCVar5;
  Object *pOVar6;
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  *pvVar7;
  const_iterator __first;
  difference_type dVar8;
  vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_> *pvVar9;
  const_iterator cVar10;
  const_iterator __last;
  __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
  __last_00;
  difference_type dVar11;
  string *__lhs;
  char *__s;
  _Base_ptr this_02;
  pointer ppVar12;
  AnimationCurveMap *this_03;
  reference __p;
  KeyTimeList *this_04;
  KeyValueList *this_05;
  reference plVar13;
  morphKeyData *this_06;
  pointer ppVar14;
  _Base_ptr *this_07;
  const_reference pvVar15;
  pair<const_char_*,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
  pVar16;
  pair<long,_morphKeyData_*> pVar17;
  __enable_if_t<is_constructible<value_type,_pair<long,_morphKeyData_*>_>::value,_pair<iterator,_bool>_>
  _Var18;
  Model *local_760;
  Object *local_740;
  BlendShape *local_6f0;
  float local_6cc;
  _Base_ptr local_6c8;
  undefined1 local_6c0;
  pair<long,_morphKeyData_*> local_6b8;
  _Self local_6a8;
  _Self local_6a0;
  iterator keyIt;
  morphKeyData *keyData;
  long key;
  const_iterator __end11;
  const_iterator __begin11;
  KeyTimeList *__range11;
  uint k;
  KeyValueList *values;
  KeyTimeList *keys;
  AnimationCurve *animationCurve;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
  curvesIt;
  const_iterator __end9;
  const_iterator __begin9;
  AnimationCurveMap *__range9;
  char *local_600;
  pair<const_char_*,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
  local_5f8;
  _Self local_5e8;
  allocator<char> local_5d9;
  key_type local_5d8;
  _Self local_5b8;
  iterator animIt;
  morphAnimData *animData;
  string local_588;
  undefined1 local_564 [8];
  aiString name;
  uint geoIndex;
  __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
  geoIt;
  Model *model;
  Connection *geoConnection;
  iterator __end7;
  iterator __begin7;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range7;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  geoConnections;
  Geometry *geo;
  Connection *bsConnection;
  iterator __end5;
  iterator __begin5;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range5;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bsConnections;
  value_type_conflict2 local_9c;
  const_iterator cStack_98;
  uint channelIndex;
  BlendShapeChannel **local_90;
  __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
  local_88;
  __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
  local_80;
  __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
  channelIt;
  BlendShape *bs;
  Connection *bscConnection;
  iterator __end2;
  iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bscConnections;
  AnimationCurveNode *node_local;
  BlendShapeChannel *bsc_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
  *morphAnimDatas_local;
  FBXConverter *this_local;
  
  pDVar1 = this->doc;
  bscConnections.
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)node;
  node_local = (AnimationCurveNode *)bsc;
  bsc_local = (BlendShapeChannel *)morphAnimDatas;
  morphAnimDatas_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
        *)this;
  uVar4 = FBX::Object::ID((Object *)bsc);
  Document::GetConnectionsBySourceSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2,pDVar1,uVar4,"Deformer");
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    *)&__range2);
  bscConnection =
       (Connection *)
       std::
       vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
       end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            *)&__range2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                *)&bscConnection);
    if (!bVar3) break;
    ppCVar5 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    pOVar6 = Connection::DestinationObject(*ppCVar5);
    if (pOVar6 == (Object *)0x0) {
      local_6f0 = (BlendShape *)0x0;
    }
    else {
      local_6f0 = (BlendShape *)
                  __dynamic_cast(pOVar6,&FBX::Object::typeinfo,&BlendShape::typeinfo,0);
    }
    if (local_6f0 != (BlendShape *)0x0) {
      pvVar7 = BlendShape::BlendShapeChannels(local_6f0);
      local_88._M_current =
           (BlendShapeChannel **)
           std::
           vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
           ::begin(pvVar7);
      pvVar7 = BlendShape::BlendShapeChannels(local_6f0);
      local_90 = (BlendShapeChannel **)
                 std::
                 vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                 ::end(pvVar7);
      local_80 = std::
                 find<__gnu_cxx::__normal_iterator<Assimp::FBX::BlendShapeChannel_const*const*,std::vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>>,Assimp::FBX::BlendShapeChannel_const*>
                           (local_88,(__normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
                                      )local_90,(BlendShapeChannel **)&node_local);
      pvVar7 = BlendShape::BlendShapeChannels(local_6f0);
      cStack_98 = std::
                  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                  ::end(pvVar7);
      bVar3 = __gnu_cxx::operator!=(&local_80,&stack0xffffffffffffff68);
      if (bVar3) {
        pvVar7 = BlendShape::BlendShapeChannels(local_6f0);
        __first = std::
                  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                  ::begin(pvVar7);
        bsConnections.
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_80._M_current;
        dVar8 = std::
                distance<__gnu_cxx::__normal_iterator<Assimp::FBX::BlendShapeChannel_const*const*,std::vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>>>
                          ((__normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
                            )__first._M_current,local_80);
        local_9c = (value_type_conflict2)dVar8;
        pDVar1 = this->doc;
        uVar4 = FBX::Object::ID((Object *)local_6f0);
        Document::GetConnectionsBySourceSequenced
                  ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    *)&__range5,pDVar1,uVar4,"Geometry");
        __end5 = std::
                 vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          *)&__range5);
        bsConnection = (Connection *)
                       std::
                       vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                       ::end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                              *)&__range5);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end5,(__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                      *)&bsConnection);
          if (!bVar3) break;
          ppCVar5 = __gnu_cxx::
                    __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                    ::operator*(&__end5);
          pOVar6 = Connection::DestinationObject(*ppCVar5);
          if (pOVar6 == (Object *)0x0) {
            local_740 = (Object *)0x0;
          }
          else {
            local_740 = (Object *)
                        __dynamic_cast(pOVar6,&FBX::Object::typeinfo,&Geometry::typeinfo,0);
          }
          geoConnections.
          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_740;
          if (local_740 != (Object *)0x0) {
            pDVar1 = this->doc;
            uVar4 = FBX::Object::ID(local_740);
            Document::GetConnectionsBySourceSequenced
                      ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                        *)&__range7,pDVar1,uVar4,"Model");
            __end7 = std::
                     vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                     ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                              *)&__range7);
            geoConnection =
                 (Connection *)
                 std::
                 vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 ::end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                        *)&__range7);
            while( true ) {
              bVar3 = __gnu_cxx::operator!=
                                (&__end7,(__normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                          *)&geoConnection);
              if (!bVar3) break;
              ppCVar5 = __gnu_cxx::
                        __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                        ::operator*(&__end7);
              pOVar6 = Connection::DestinationObject(*ppCVar5);
              if (pOVar6 == (Object *)0x0) {
                local_760 = (Model *)0x0;
              }
              else {
                local_760 = (Model *)__dynamic_cast(pOVar6,&FBX::Object::typeinfo,&Model::typeinfo,0
                                                   );
              }
              if (local_760 != (Model *)0x0) {
                pvVar9 = Model::GetGeometry(local_760);
                cVar10 = std::
                         vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                         ::begin(pvVar9);
                pvVar9 = Model::GetGeometry(local_760);
                __last = std::
                         vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                         ::end(pvVar9);
                __last_00 = std::
                            find<__gnu_cxx::__normal_iterator<Assimp::FBX::Geometry_const*const*,std::vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>>>,Assimp::FBX::Geometry_const*>
                                      (cVar10._M_current,__last._M_current,
                                       (Geometry **)
                                       &geoConnections.
                                        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar9 = Model::GetGeometry(local_760);
                cVar10 = std::
                         vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>
                         ::begin(pvVar9);
                name.data._1016_8_ = __last_00;
                dVar11 = std::
                         distance<__gnu_cxx::__normal_iterator<Assimp::FBX::Geometry_const*const*,std::vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>>>>
                                   ((__normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
                                     )cVar10._M_current,__last_00);
                __lhs = FBX::Object::Name_abi_cxx11_(&local_760->super_Object);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &animData,__lhs,"*");
                FixNodeName(&local_588,this,(string *)&animData);
                aiString::aiString((aiString *)local_564,&local_588);
                std::__cxx11::string::~string((string *)&local_588);
                std::__cxx11::string::~string((string *)&animData);
                local_564._0_4_ =
                     ASSIMP_itoa10(local_564 + (ulong)(uint)local_564._0_4_ + 4,0x3ff,
                                   (int32_t)dVar11);
                pBVar2 = bsc_local;
                local_564._0_4_ = local_564._0_4_ + 1;
                __s = aiString::C_Str((aiString *)local_564);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5d8,__s,&local_5d9);
                local_5b8._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                             *)pBVar2,&local_5d8);
                std::__cxx11::string::~string((string *)&local_5d8);
                std::allocator<char>::~allocator(&local_5d9);
                local_5e8._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                            *)bsc_local);
                bVar3 = std::operator==(&local_5b8,&local_5e8);
                if (bVar3) {
                  this_02 = (_Base_ptr)operator_new(0x30);
                  *(_Base_ptr *)(this_02 + 1) = (_Base_ptr)0x0;
                  this_02[1]._M_parent = (_Base_ptr)0x0;
                  this_02->_M_left = (_Base_ptr)0x0;
                  this_02->_M_right = (_Base_ptr)0x0;
                  *(undefined8 *)this_02 = 0;
                  *(undefined8 *)&((_Rb_tree_header *)&this_02->_M_parent)->_M_header = 0;
                  std::
                  map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                  ::map((map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                         *)this_02);
                  pBVar2 = bsc_local;
                  animIt._M_node = this_02;
                  local_600 = aiString::C_Str((aiString *)local_564);
                  pVar16 = std::
                           make_pair<char_const*,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*&>
                                     (&local_600,
                                      (map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                                       **)&animIt);
                  local_5f8 = pVar16;
                  std::
                  map<std::__cxx11::string,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                  ::
                  insert<std::pair<char_const*,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>
                            ((map<std::__cxx11::string,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                              *)pBVar2,&local_5f8);
                }
                else {
                  ppVar12 = std::
                            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>
                            ::operator->(&local_5b8);
                  animIt._M_node = (_Base_ptr)ppVar12->second;
                }
                this_03 = AnimationCurveNode::Curves_abi_cxx11_
                                    ((AnimationCurveNode *)
                                     bscConnections.
                                     super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                __end9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
                         ::begin(this_03);
                curvesIt.second =
                     (AnimationCurve *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
                     ::end(this_03);
                while( true ) {
                  bVar3 = std::operator!=(&__end9,(_Self *)&curvesIt.second);
                  if (!bVar3) break;
                  __p = std::
                        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>
                        ::operator*(&__end9);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
                  ::
                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_true>
                            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
                              *)&animationCurve,__p);
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&animationCurve,"d|DeformPercent");
                  this_00 = curvesIt.first.field_2._8_8_;
                  if (bVar3) {
                    this_04 = AnimationCurve::GetKeys
                                        ((AnimationCurve *)curvesIt.first.field_2._8_8_);
                    this_05 = AnimationCurve::GetValues((AnimationCurve *)this_00);
                    __range11._4_4_ = 0;
                    __end11 = std::vector<long,_std::allocator<long>_>::begin(this_04);
                    key = (long)std::vector<long,_std::allocator<long>_>::end(this_04);
                    while( true ) {
                      bVar3 = __gnu_cxx::operator!=
                                        (&__end11,(
                                                  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                                  *)&key);
                      if (!bVar3) break;
                      plVar13 = __gnu_cxx::
                                __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                ::operator*(&__end11);
                      keyData = (morphKeyData *)*plVar13;
                      local_6a0._M_node =
                           (_Base_ptr)
                           std::
                           map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                           ::find(animIt._M_node,(key_type_conflict4 *)&keyData);
                      local_6a8._M_node =
                           (_Base_ptr)
                           std::
                           map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                           ::end(animIt._M_node);
                      bVar3 = std::operator==(&local_6a0,&local_6a8);
                      if (bVar3) {
                        this_06 = (morphKeyData *)operator_new(0x30);
                        (this_06->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_finish = (pointer)0x0;
                        (this_06->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        (this_06->values).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        (this_06->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_start = (pointer)0x0;
                        (this_06->values).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start = (pointer)0x0;
                        (this_06->values).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish = (pointer)0x0;
                        morphKeyData::morphKeyData(this_06);
                        this_01 = animIt;
                        keyIt._M_node = (_Base_ptr)this_06;
                        pVar17 = std::make_pair<long&,morphKeyData*&>
                                           ((long *)&keyData,(morphKeyData **)&keyIt);
                        local_6b8 = pVar17;
                        _Var18 = std::
                                 map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                 ::insert<std::pair<long,morphKeyData*>>
                                           ((map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                             *)this_01._M_node,&local_6b8);
                        local_6c8 = (_Base_ptr)_Var18.first._M_node;
                        local_6c0 = _Var18.second;
                      }
                      else {
                        ppVar14 = std::_Rb_tree_iterator<std::pair<const_long,_morphKeyData_*>_>::
                                  operator->(&local_6a0);
                        keyIt._M_node = (_Base_ptr)ppVar14->second;
                      }
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 keyIt._M_node,&local_9c);
                      this_07 = &(keyIt._M_node)->_M_right;
                      pvVar15 = std::vector<float,_std::allocator<float>_>::at
                                          (this_05,(ulong)__range11._4_4_);
                      local_6cc = *pvVar15 / 100.0;
                      std::vector<float,_std::allocator<float>_>::push_back
                                ((vector<float,_std::allocator<float>_> *)this_07,&local_6cc);
                      __range11._4_4_ = __range11._4_4_ + 1;
                      __gnu_cxx::
                      __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator++(&__end11);
                    }
                  }
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
                           *)&animationCurve);
                  std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>
                  ::operator++(&__end9);
                }
              }
              __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator++(&__end7);
            }
            std::
            vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ::~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                       *)&__range7);
          }
          __gnu_cxx::
          __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
          ::operator++(&__end5);
        }
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&__range5);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)&__range2);
  return;
}

Assistant:

void FBXConverter::ProcessMorphAnimDatas(std::map<std::string, morphAnimData*>* morphAnimDatas, const BlendShapeChannel* bsc, const AnimationCurveNode* node) {
            std::vector<const Connection*> bscConnections = doc.GetConnectionsBySourceSequenced(bsc->ID(), "Deformer");
            for (const Connection* bscConnection : bscConnections) {
                auto bs = dynamic_cast<const BlendShape*>(bscConnection->DestinationObject());
                if (bs) {
                    auto channelIt = std::find(bs->BlendShapeChannels().begin(), bs->BlendShapeChannels().end(), bsc);
                    if (channelIt != bs->BlendShapeChannels().end()) {
                        auto channelIndex = static_cast<unsigned int>(std::distance(bs->BlendShapeChannels().begin(), channelIt));
                        std::vector<const Connection*> bsConnections = doc.GetConnectionsBySourceSequenced(bs->ID(), "Geometry");
                        for (const Connection* bsConnection : bsConnections) {
                            auto geo = dynamic_cast<const Geometry*>(bsConnection->DestinationObject());
                            if (geo) {
                                std::vector<const Connection*> geoConnections = doc.GetConnectionsBySourceSequenced(geo->ID(), "Model");
                                for (const Connection* geoConnection : geoConnections) {
                                    auto model = dynamic_cast<const Model*>(geoConnection->DestinationObject());
                                    if (model) {
                                        auto geoIt = std::find(model->GetGeometry().begin(), model->GetGeometry().end(), geo);
                                        auto geoIndex = static_cast<unsigned int>(std::distance(model->GetGeometry().begin(), geoIt));
                                        auto name = aiString(FixNodeName(model->Name() + "*"));
                                        name.length = 1 + ASSIMP_itoa10(name.data + name.length, MAXLEN - 1, geoIndex);
                                        morphAnimData* animData;
                                        auto animIt = morphAnimDatas->find(name.C_Str());
                                        if (animIt == morphAnimDatas->end()) {
                                            animData = new morphAnimData();
                                            morphAnimDatas->insert(std::make_pair(name.C_Str(), animData));
                                        }
                                        else {
                                            animData = animIt->second;
                                        }
                                        for (std::pair<std::string, const AnimationCurve*> curvesIt : node->Curves()) {
                                            if (curvesIt.first == "d|DeformPercent") {
                                                const AnimationCurve* animationCurve = curvesIt.second;
                                                const KeyTimeList& keys = animationCurve->GetKeys();
                                                const KeyValueList& values = animationCurve->GetValues();
                                                unsigned int k = 0;
                                                for (auto key : keys) {
                                                    morphKeyData* keyData;
                                                    auto keyIt = animData->find(key);
                                                    if (keyIt == animData->end()) {
                                                        keyData = new morphKeyData();
                                                        animData->insert(std::make_pair(key, keyData));
                                                    }
                                                    else {
                                                        keyData = keyIt->second;
                                                    }
                                                    keyData->values.push_back(channelIndex);
                                                    keyData->weights.push_back(values.at(k) / 100.0f);
                                                    k++;
                                                }
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }